

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

first_of_any_result __thiscall
c4::basic_substring<char_const>::first_of_any_iter<c4::basic_substring<char_const>*>
          (basic_substring<const_char> *this,basic_substring<const_char> *first_span,
          basic_substring<const_char> *last_span)

{
  char cVar1;
  first_of_any_result fVar2;
  bool bVar3;
  bool bVar4;
  error_flags eVar5;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  size_t j;
  bool gotit;
  basic_substring<const_char> *chars;
  basic_substring<const_char> *it;
  size_t curr;
  size_t i;
  ulong local_78;
  long *local_60;
  size_t local_58;
  ulong local_50;
  size_t local_30;
  size_t local_28;
  
  local_50 = 0;
  do {
    if ((ulong)in_RDI[1] <= local_50) {
      local_30 = 0xffffffffffffffff;
      local_28 = 0xffffffffffffffff;
LAB_003e80d1:
      fVar2.pos = local_28;
      fVar2.which = local_30;
      return fVar2;
    }
    local_58 = 0;
    for (local_60 = in_RSI; local_60 != in_RDX; local_60 = local_60 + 2) {
      if (local_50 + local_60[1] <= (ulong)in_RDI[1]) {
        bVar3 = true;
        for (local_78 = 0; local_78 < (ulong)local_60[1]; local_78 = local_78 + 1) {
          if ((ulong)in_RDI[1] <= local_50 + local_78) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              trap_instruction();
            }
            handle_error(0x3fa1ef,(char *)0x167a,"check failed: %s","i + j < len");
          }
          cVar1 = *(char *)(*in_RDI + local_50 + local_78);
          if ((ulong)local_60[1] <= local_78) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              trap_instruction();
            }
            handle_error(0x3fa1ef,(char *)0x14c4,"check failed: %s","i >= 0 && i < len");
          }
          if (cVar1 != *(char *)(*local_60 + local_78)) {
            bVar3 = false;
            break;
          }
        }
        if (bVar3) {
          local_30 = local_58;
          local_28 = local_50;
          goto LAB_003e80d1;
        }
      }
      local_58 = local_58 + 1;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

first_of_any_result first_of_any_iter(It first_span, It last_span) const
    {
        for(size_t i = 0; i < len; ++i)
        {
            size_t curr = 0;
            for(It it = first_span; it != last_span; ++curr, ++it)
            {
                auto const& chars = *it;
                if((i + chars.len) > len) continue;
                bool gotit = true;
                for(size_t j = 0; j < chars.len; ++j)
                {
                    C4_ASSERT(i + j < len);
                    if(str[i + j] != chars[j])
                    {
                        gotit = false;
                        break;
                    }
                }
                if(gotit)
                {
                    return {curr, i};
                }
            }
        }
        return {NONE, npos};
    }